

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelCreationUtils.cpp
# Opt level: O3

NeuralNetwork * addSoftmaxLayer(Model *m,char *name,char *input,char *output)

{
  NeuralNetwork *this;
  Type *this_00;
  SoftmaxLayerParams *this_01;
  
  if (m->_oneof_case_[0] == 500) {
    this = (NeuralNetwork *)(m->Type_).pipeline_;
  }
  else {
    CoreML::Specification::Model::clear_Type(m);
    m->_oneof_case_[0] = 500;
    this = (NeuralNetwork *)operator_new(0x58);
    CoreML::Specification::NeuralNetwork::NeuralNetwork(this);
    (m->Type_).neuralnetwork_ = this;
  }
  this_00 = google::protobuf::internal::RepeatedPtrFieldBase::
            Add<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                      (&(this->layers_).super_RepeatedPtrFieldBase,(Type *)0x0);
  CoreML::Specification::NeuralNetworkLayer::set_name(this_00,name);
  CoreML::Specification::NeuralNetworkLayer::add_input(this_00,input);
  CoreML::Specification::NeuralNetworkLayer::add_output(this_00,output);
  if (this_00->_oneof_case_[0] != 0xaf) {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(this_00);
    this_00->_oneof_case_[0] = 0xaf;
    this_01 = (SoftmaxLayerParams *)operator_new(0x18);
    CoreML::Specification::SoftmaxLayerParams::SoftmaxLayerParams(this_01);
    (this_00->layer_).softmax_ = this_01;
  }
  return this;
}

Assistant:

Specification::NeuralNetwork* addSoftmaxLayer(Specification::Model& m, const char *name,  const char *input, const char *output) {
    
    auto neuralNet = m.mutable_neuralnetwork();
    auto softmaxLayer = neuralNet->add_layers();
    
    softmaxLayer->set_name(name);
    softmaxLayer->add_input(input);
    softmaxLayer->add_output(output);
    softmaxLayer->mutable_softmax();
    
    return neuralNet;
}